

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
kratos::Generator::add_child_generator
          (Generator *this,string *instance_name_,shared_ptr<kratos::Generator> *child)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
  *this_00;
  element_type *peVar1;
  iterator iVar2;
  GeneratorException *this_01;
  mapped_type *pmVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  string local_80;
  element_type *local_60;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_58;
  size_type sStack_40;
  allocator_type local_31;
  
  std::__cxx11::string::_M_assign
            ((string *)
             &((child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              instance_name);
  this_00 = &this->children_;
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,
                 &((child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->instance_name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Generator>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Generator>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string&,std::shared_ptr<kratos::Generator>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Generator>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Generator>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,
               &((child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->instance_name,child);
    peVar1 = (child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar1->parent_generator_ = this;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->children_names_,&peVar1->instance_name);
    return;
  }
  this_01 = (GeneratorException *)__cxa_allocate_exception(0x10);
  peVar1 = (child->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(peVar1->instance_name)._M_dataplus._M_p;
  local_58.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(peVar1->instance_name)._M_string_length;
  local_58.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->instance_name)._M_dataplus._M_p;
  sStack_40 = (this->instance_name)._M_string_length;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x1a;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_80,(detail *)"{0} already exists  in {1}",format_str,args);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>_>
           ::at(this_00,instance_name_);
  local_60 = (pmVar3->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_60;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_58,__l,&local_31);
  GeneratorException::GeneratorException(this_01,&local_80,&local_58);
  __cxa_throw(this_01,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Generator::add_child_generator(const std::string &instance_name_,
                                    const std::shared_ptr<Generator> &child) {
    child->instance_name = instance_name_;
    if (children_.find(child->instance_name) == children_.end()) {
        children_.emplace(child->instance_name, child);
        child->parent_generator_ = this;
        children_names_.emplace_back(child->instance_name);
    } else {
        throw GeneratorException(
            ::format("{0} already exists  in {1}", child->instance_name, instance_name),
            {children_.at(instance_name_).get()});
    }
}